

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.c
# Opt level: O0

void putbyte(ubyte byte,uint address)

{
  uint address_local;
  ubyte byte_local;
  
  if (address < 0x8000) {
    if (ram_screen_start <= address) {
      (*screen_byte_P)(byte,address);
    }
    RAM[address] = byte;
  }
  else if ((address & 0xff00) == 0xfe00) {
    (*wsheila[(char)address])(byte);
  }
  else if ((address < 0xfc00) || (0xfeff < address)) {
    printf("\nROM write attempt at %X",(ulong)address);
    exit(1);
  }
  return;
}

Assistant:

void putbyte(ubyte byte, uint address) {
    if (address < 0x8000) {
        if (address >= ram_screen_start)  // if screen RAM
            screen_byte_P(byte, address); // output screen data

        RAM[address] = byte;              // update RAM
    }

    else if ((address & 0xFF00) == 0xFE00) wsheila[(char) (address)](byte);

    else if ((address < 0xFC00) || (address > 0xFEFF)) {
        // Since this is an impossible situation, a crash probably has occured
        // therefore display error and exit
        printf("\nROM write attempt at %X", address);
        exit(1);
    }
}